

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::do_resume(torrent *this)

{
  bool bVar1;
  uint uVar2;
  time_point32 tVar3;
  element_type *peVar4;
  alert_manager *paVar5;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_30;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  torrent *this_local;
  
  bVar1 = is_paused(this);
  if (bVar1) {
    update_want_tick(this);
  }
  else {
    __end2 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
             ::begin(&this->m_extensions);
    ext = (shared_ptr<libtorrent::torrent_plugin> *)
          ::std::__cxx11::
          list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
          ::end(&this->m_extensions);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&ext), bVar1) {
      local_30._M_head_impl =
           (hash_picker *)
           ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*(&__end2);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30._M_head_impl);
      uVar2 = (*peVar4->_vptr_torrent_plugin[7])();
      if ((uVar2 & 1) != 0) {
        return;
      }
      ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
    }
    paVar5 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::torrent_resumed_alert>(paVar5);
    if (bVar1) {
      paVar5 = alerts(this);
      get_handle((torrent *)&stack0xffffffffffffffc0);
      alert_manager::emplace_alert<libtorrent::torrent_resumed_alert,libtorrent::torrent_handle>
                (paVar5,(torrent_handle *)&stack0xffffffffffffffc0);
      torrent_handle::~torrent_handle((torrent_handle *)&stack0xffffffffffffffc0);
    }
    *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd & 0xfeffffff | 0x1000000;
    this->field_0x5c0 = this->field_0x5c0 & 0xfe | 1;
    this->field_0x5c0 = this->field_0x5c0 & 0xfd | 2;
    tVar3 = time_now32();
    (this->m_started).__d.__r = (rep_conflict)tVar3.__d.__r;
    bVar1 = is_seed(this);
    if (bVar1) {
      (this->m_became_seed).__d.__r = (this->m_started).__d.__r;
    }
    bVar1 = is_finished(this);
    if (bVar1) {
      (this->m_became_finished).__d.__r = (this->m_started).__d.__r;
    }
    clear_error(this);
    if ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
         == 1) && ((*(uint *)&this->field_0x600 & 1) != 0)) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
    bVar1 = should_check_files(this);
    if (bVar1) {
      start_checking(this);
    }
    state_updated(this);
    update_want_peers(this);
    update_want_tick(this);
    update_want_scrape(this);
    update_gauge(this);
    if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) !=
        1) {
      start_announcing(this);
      do_connect_boost(this);
    }
  }
  return;
}

Assistant:

void torrent::do_resume()
	{
		TORRENT_ASSERT(is_single_thread());
		if (is_paused())
		{
			update_want_tick();
			return;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			if (ext->on_resume()) return;
		}
#endif

		if (alerts().should_post<torrent_resumed_alert>())
			alerts().emplace_alert<torrent_resumed_alert>(get_handle());

		m_announce_to_dht = true;
		m_announce_to_trackers = true;
		m_announce_to_lsd = true;

		m_started = aux::time_now32();
		if (is_seed()) m_became_seed = m_started;
		if (is_finished()) m_became_finished = m_started;

		clear_error();

		if (m_state == torrent_status::checking_files
			&& m_auto_managed)
		{
			m_ses.trigger_auto_manage();
		}

		if (should_check_files()) start_checking();

		state_updated();
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();

		if (m_state == torrent_status::checking_files) return;

		start_announcing();

		do_connect_boost();
	}